

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

void ZydisSetAVXInformation
               (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
               ZydisInstructionDefinition *definition)

{
  ZyanU8 ZVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  byte local_41;
  ZyanU8 index;
  ZydisInstructionDefinitionMVEX *def_2;
  ZyanU8 evex_b_2;
  ZyanU8 size_index_2;
  ZyanU8 size_index_1;
  ZyanU8 evex_b_1;
  ZyanU8 size_index;
  ZyanU8 evex_b;
  ZyanU8 vector_length;
  ZydisInstructionDefinitionEVEX *def_1;
  ZydisInstructionDefinitionVEX *def;
  ZydisInstructionDefinition *definition_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x8ff,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x900,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  if (definition == (ZydisInstructionDefinition *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x901,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  switch(instruction->encoding) {
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    if (1 < (context->vector_unified).LL) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x90d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length = ZydisSetAVXInformation::lookup[(context->vector_unified).LL];
    break;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    if (1 < (context->vector_unified).LL) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x919,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         ZydisSetAVXInformation::lookup_1[(context->vector_unified).LL];
    if ((*(ushort *)(definition + 1) >> 6 & 7) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      (instruction->avx).broadcast.mode =
           ZydisSetAVXInformation::broadcasts[(byte)(*(ushort *)(definition + 1) >> 6) & 7];
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    def_2._7_1_ = (context->vector_unified).LL;
    if (*(byte *)(definition + 1) >> 6 != 0) {
      def_2._7_1_ = (*(byte *)(definition + 1) >> 6) - 1;
    }
    if (2 < def_2._7_1_) {
      __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x942,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length = ZydisSetAVXInformation::lookup_2[def_2._7_1_];
    (context->evex).tuple_type = definition[1].field_0x1 & 0x1f;
    if ((definition[1].field_0x1 & 0x1f) == 0) {
      if ((instruction->raw).modrm.mod != '\x03') {
        __assert_fail("instruction->raw.modrm.mod == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa7e,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      if ((instruction->raw).modrm.mod == '\x03') {
        __assert_fail("instruction->raw.modrm.mod != 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x948,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((byte)definition[1].field_0x1 >> 5 == 0) {
        __assert_fail("def->element_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x949,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (5 < (byte)definition[1].field_0x1 >> 5) {
        __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x950,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (context->evex).element_size = ""[(byte)definition[1].field_0x1 >> 5];
      switch(definition[1].field_0x1 & 0x1f) {
      case 1:
        bVar3 = (instruction->raw).field_3.evex.b;
        if (1 < bVar3) {
          __assert_fail("evex_b < 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x959,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (((bVar3 != 0) &&
            (((context->vector_unified).W != '\0' ||
             (((context->evex).element_size != '\x10' && ((context->evex).element_size != ' '))))))
           && (((context->vector_unified).W == '\0' || ((context->evex).element_size != '@')))) {
          __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x95c,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((bVar3 != 0) && (((byte)*(undefined2 *)&definition[1].field_0x2 & 3) != 1)) {
          __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x95d,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar2 = (byte)((int)(uint)(context->evex).element_size >> 5);
        if (2 < bVar2) {
          __assert_fail("size_index < 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x993,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = ZydisSetAVXInformation::scales[bVar3][bVar2][def_2._7_1_];
        (instruction->avx).broadcast.mode =
             ZydisSetAVXInformation::broadcasts_1[bVar3][bVar2][def_2._7_1_];
        break;
      case 2:
        bVar3 = (instruction->raw).field_3.evex.b;
        if (1 < bVar3) {
          __assert_fail("evex_b < 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x99c,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((context->vector_unified).W != '\0') {
          __assert_fail("!context->vector_unified.W",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x99d,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if (((context->evex).element_size != '\x10') && ((context->evex).element_size != ' ')) {
          __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x99f,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((bVar3 != 0) && (((byte)*(undefined2 *)&definition[1].field_0x2 & 3) != 1)) {
          __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x9a0,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar2 = (byte)((int)(uint)(context->evex).element_size >> 5);
        if (2 < bVar2) {
          __assert_fail("size_index < 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x9ca,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = ZydisSetAVXInformation::scales_1[bVar3][bVar2][def_2._7_1_];
        (instruction->avx).broadcast.mode =
             ZydisSetAVXInformation::broadcasts_2[bVar3][bVar2][def_2._7_1_];
        break;
      case 3:
        context->cd8_scale = "\x10 @"[def_2._7_1_];
        break;
      case 5:
        bVar3 = (byte)((int)(uint)(context->evex).element_size >> 5);
        if (2 < bVar3) {
          __assert_fail("size_index < 3",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x9ff,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = "\x02\x04\b"[bVar3];
        break;
      case 6:
        if ((context->evex).element_size != ' ') {
          __assert_fail("context->evex.element_size == 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa05,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((context->vector_unified).W != '\0') {
          __assert_fail("context->vector_unified.W == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa06,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = '\x10';
        break;
      case 7:
        ZVar1 = (context->vector_unified).W;
        if (ZVar1 == '\0') {
          if ((context->evex).element_size != ' ') {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x9dd,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
        }
        else {
          if (ZVar1 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x9e3,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((context->evex).element_size != '@') {
            __assert_fail("context->evex.element_size == 64",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x9e0,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
        }
      case 4:
        if (5 < (byte)definition[1].field_0x1 >> 5) {
          __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x9f1,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = ""[(byte)definition[1].field_0x1 >> 5];
        break;
      case 8:
        ZVar1 = (context->vector_unified).W;
        if (ZVar1 == '\0') {
          if ((context->evex).element_size != ' ') {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa0d,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          context->cd8_scale = '\b';
        }
        else {
          if (ZVar1 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa17,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((context->evex).element_size != '@') {
            __assert_fail("context->evex.element_size == 64",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa11,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (((instruction->avx).vector_length != 0x100) &&
             ((instruction->avx).vector_length != 0x200)) {
            __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa13,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          context->cd8_scale = '\x10';
        }
        break;
      case 9:
        ZVar1 = (context->vector_unified).W;
        if (ZVar1 == '\0') {
          if ((context->evex).element_size != ' ') {
            __assert_fail("context->evex.element_size == 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa1e,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if (((instruction->avx).vector_length != 0x100) &&
             ((instruction->avx).vector_length != 0x200)) {
            __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa20,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          context->cd8_scale = '\x10';
        }
        else {
          if (ZVar1 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa29,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((context->evex).element_size != '@') {
            __assert_fail("context->evex.element_size == 64",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa24,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          if ((instruction->avx).vector_length != 0x200) {
            __assert_fail("instruction->avx.vector_length == 512",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xa25,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          context->cd8_scale = ' ';
        }
        break;
      case 10:
        if ((context->vector_unified).W != '\0') {
          __assert_fail("!context->vector_unified.W",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa2d,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((instruction->avx).vector_length != 0x200) {
          __assert_fail("instruction->avx.vector_length == 512",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa2e,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((context->evex).element_size != ' ') {
          __assert_fail("context->evex.element_size == 32",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa2f,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = ' ';
        break;
      case 0xb:
        context->cd8_scale = "\b\x10 "[def_2._7_1_];
        break;
      case 0xc:
        context->cd8_scale = "\x04\b\x10"[def_2._7_1_];
        break;
      case 0xd:
        context->cd8_scale = "\x02\x04\b"[def_2._7_1_];
        break;
      case 0xe:
        context->cd8_scale = '\x10';
        break;
      case 0xf:
        context->cd8_scale = "\b @"[def_2._7_1_];
        break;
      case 0x10:
        bVar3 = (instruction->raw).field_3.evex.b;
        if (1 < bVar3) {
          __assert_fail("evex_b < 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa5c,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((context->vector_unified).W != '\0') {
          __assert_fail("!context->vector_unified.W",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa5d,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((context->evex).element_size != '\x10') {
          __assert_fail("context->evex.element_size == 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa5e,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        if ((bVar3 != 0) && (((byte)*(undefined2 *)&definition[1].field_0x2 & 3) != 1)) {
          __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xa5f,
                        "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        context->cd8_scale = ZydisSetAVXInformation::scales_9[bVar3][def_2._7_1_];
        (instruction->avx).broadcast.mode = ZydisSetAVXInformation::broadcasts_3[bVar3][def_2._7_1_]
        ;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa7a,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    if ((*(ushort *)&definition[1].field_0x2 >> 7 & 0xf) != 0) {
      if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID) {
        __assert_fail("!instruction->avx.broadcast.mode",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa84,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (instruction->avx).broadcast.is_static = '\x01';
      if (0xc < ((byte)(*(ushort *)&definition[1].field_0x2 >> 7) & 0xf)) {
        __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa96,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (instruction->avx).broadcast.mode =
           ZydisSetAVXInformation::broadcasts_4
           [(byte)(*(ushort *)&definition[1].field_0x2 >> 7) & 0xf];
    }
    if (((instruction->raw).field_3.evex.b != '\0') &&
       (uVar4 = *(ushort *)&definition[1].field_0x2 & 3, 1 < (byte)uVar4)) {
      if (uVar4 == 2) {
        (instruction->avx).rounding.mode = (context->vector_unified).LL + ZYDIS_ROUNDING_MODE_RN;
      }
      else if (uVar4 != 3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xaaa,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (instruction->avx).has_sae = '\x01';
    }
    (instruction->avx).mask.reg = (instruction->raw).field_3.evex.aaa + ZYDIS_REGISTER_K0;
    uVar4 = *(ushort *)&definition[1].field_0x2 >> 5;
    uVar5 = uVar4 & 3;
    if ((uVar4 & 3) == 0) {
      (instruction->avx).mask.mode = (instruction->raw).field_3.xop.offset + ZYDIS_MASK_MODE_MERGING
      ;
    }
    else if (uVar5 == 1) {
      (instruction->avx).mask.mode = ZYDIS_MASK_MODE_REQUIRED_BITS;
    }
    else {
      if (uVar5 != 2) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xabc,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (instruction->avx).mask.mode = (instruction->raw).field_3.xop.offset + ZYDIS_MASK_MODE_CONTROL
      ;
    }
    if ((instruction->raw).field_3.evex.aaa == '\0') {
      (instruction->avx).mask.mode = ZYDIS_MASK_MODE_DISABLED;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    (instruction->avx).vector_length = 0x200;
    local_41 = (byte)((ushort)*(undefined2 *)(definition + 1) >> 0xd) & 1;
    if ((local_41 != 0) && ((*(uint3 *)(definition + 1) >> 0xe & 7) != 0)) {
      __assert_fail("!index || !def->broadcast",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xad2,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_41 == 0) && ((*(uint3 *)(definition + 1) >> 0xe & 7) != 0)) {
      (instruction->avx).broadcast.is_static = '\x01';
      switch(*(uint3 *)(definition + 1) >> 0xe & 7) {
      case 1:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        local_41 = 1;
        break;
      case 2:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        local_41 = 1;
        break;
      case 3:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
        local_41 = 2;
        break;
      case 4:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        local_41 = 2;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xae9,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    switch(*(ushort *)(definition + 1) >> 6 & 0x1f) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
      break;
    case 4:
    case 5:
    case 6:
    case 7:
      context->cd8_scale = '@';
      break;
    case 10:
    case 0xb:
    case 0xc:
    case 0x12:
      if (7 < (instruction->raw).field_3.vex.size) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb09,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      context->cd8_scale =
           ZydisSetAVXInformation::lookup_3[local_41][(instruction->raw).field_3.vex.size];
      break;
    case 0xd:
    case 0x11:
    case 0x13:
    case 0x15:
      if (2 < (instruction->raw).field_3.vex.size) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb27,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      context->cd8_scale =
           ZydisSetAVXInformation::lookup_5[local_41][(instruction->raw).field_3.vex.size];
      break;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x14:
      if (7 < (instruction->raw).field_3.vex.size) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb18,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      context->cd8_scale =
           ZydisSetAVXInformation::lookup_4[local_41][(instruction->raw).field_3.vex.size];
      break;
    case 0x16:
    case 0x18:
      if (1 < local_41) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb33,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (7 < (instruction->raw).field_3.vex.size) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb34,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      context->cd8_scale =
           ZydisSetAVXInformation::lookup_6[local_41][(instruction->raw).field_3.vex.size];
      break;
    case 0x17:
    case 0x19:
      if (1 < local_41) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb40,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((instruction->raw).field_3.vex.size != '\0') {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb41,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      context->cd8_scale =
           ZydisSetAVXInformation::lookup_7
           [(ulong)(instruction->raw).field_3.vex.size + (ulong)local_41][0];
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xb46,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (context->mvex).functionality = (byte)(*(ushort *)(definition + 1) >> 6) & 0x1f;
    switch(*(ushort *)(definition + 1) >> 6 & 0x1f) {
    case 0:
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
      break;
    case 2:
      (instruction->avx).rounding.mode =
           ((instruction->raw).field_3.vex.size & 3) + ZYDIS_ROUNDING_MODE_RN;
    case 3:
      if (3 < (instruction->raw).field_3.vex.size) {
        (instruction->avx).has_sae = '\x01';
      }
      break;
    case 8:
    case 9:
      (instruction->avx).swizzle.mode =
           (instruction->raw).field_3.vex.size + ZYDIS_SWIZZLE_MODE_DCBA;
      break;
    case 10:
    case 0xb:
    case 0xc:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      case '\x01':
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
      case '\x02':
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      case '\x03':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
        break;
      case '\x04':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb7f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      break;
    case 0xd:
    case 0x11:
      ZVar1 = (instruction->raw).field_3.vex.size;
      if (ZVar1 != '\0') {
        if (ZVar1 == '\x01') {
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        }
        else {
          if (ZVar1 != '\x02') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xbac,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
        }
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      case '\x01':
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
      case '\x02':
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb9c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
      }
      break;
    case 0x12:
    case 0x16:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xbc5,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x03':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
        break;
      case '\x04':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
      }
      break;
    case 0x13:
    case 0x17:
      break;
    case 0x14:
    case 0x18:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xbde,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
      }
      break;
    case 0x15:
    case 0x19:
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xbe5,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (((instruction->raw).modrm.mod != '\x03') && ((instruction->raw).field_3.xop.offset != '\0'))
    {
      (instruction->avx).has_eviction_hint = '\x01';
    }
    (instruction->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
    (instruction->avx).mask.reg = (instruction->raw).field_3.evex.b + ZYDIS_REGISTER_K0;
  }
  return;
}

Assistant:

static void ZydisSetAVXInformation(ZydisDecoderContext* context,
    ZydisDecodedInstruction* instruction, const ZydisInstructionDefinition* definition)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(definition);

    switch (instruction->encoding)
    {
    case ZYDIS_INSTRUCTION_ENCODING_XOP:
    {
        // Vector length
        static const ZyanU16 lookup[2] =
        {
            128,
            256
        };
        ZYAN_ASSERT(context->vector_unified.LL < ZYAN_ARRAY_LENGTH(lookup));
        instruction->avx.vector_length = lookup[context->vector_unified.LL];
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_VEX:
    {
        // Vector length
        static const ZyanU16 lookup[2] =
        {
            128,
            256
        };
        ZYAN_ASSERT(context->vector_unified.LL < ZYAN_ARRAY_LENGTH(lookup));
        instruction->avx.vector_length = lookup[context->vector_unified.LL];

        // Static broadcast-factor
        const ZydisInstructionDefinitionVEX* def =
            (const ZydisInstructionDefinitionVEX*)definition;
        if (def->broadcast)
        {
            instruction->avx.broadcast.is_static = ZYAN_TRUE;
            static ZydisBroadcastMode broadcasts[ZYDIS_VEX_STATIC_BROADCAST_MAX_VALUE + 1] =
            {
                ZYDIS_BROADCAST_MODE_INVALID,
                ZYDIS_BROADCAST_MODE_1_TO_2,
                ZYDIS_BROADCAST_MODE_1_TO_4,
                ZYDIS_BROADCAST_MODE_1_TO_8,
                ZYDIS_BROADCAST_MODE_1_TO_16,
                ZYDIS_BROADCAST_MODE_1_TO_32,
                ZYDIS_BROADCAST_MODE_2_TO_4
            };
            instruction->avx.broadcast.mode = broadcasts[def->broadcast];
        }
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    {
#ifndef ZYDIS_DISABLE_AVX512
        const ZydisInstructionDefinitionEVEX* def =
            (const ZydisInstructionDefinitionEVEX*)definition;

        // Vector length
        ZyanU8 vector_length = context->vector_unified.LL;
        if (def->vector_length)
        {
            vector_length = def->vector_length - 1;
        }
        static const ZyanU16 lookup[3] =
        {
            128,
            256,
            512
        };
        ZYAN_ASSERT(vector_length < ZYAN_ARRAY_LENGTH(lookup));
        instruction->avx.vector_length = lookup[vector_length];

        context->evex.tuple_type = def->tuple_type;
        if (def->tuple_type)
        {
            ZYAN_ASSERT(instruction->raw.modrm.mod != 3);
            ZYAN_ASSERT(def->element_size);

            // Element size
            static const ZyanU8 element_sizes[ZYDIS_IELEMENT_SIZE_MAX_VALUE + 1] =
            {
                  0,   8,  16,  32,  64, 128
            };
            ZYAN_ASSERT(def->element_size < ZYAN_ARRAY_LENGTH(element_sizes));
            context->evex.element_size = element_sizes[def->element_size];

            // Compressed disp8 scale and broadcast-factor
            switch (def->tuple_type)
            {
            case ZYDIS_TUPLETYPE_FV:
            {
                const ZyanU8 evex_b = instruction->raw.evex.b;
                ZYAN_ASSERT(evex_b < 2);
                ZYAN_ASSERT(!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 ||
                                                                        context->evex.element_size == 32)) ||
                                        ( context->vector_unified.W &&  context->evex.element_size == 64)));
                ZYAN_ASSERT(!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC);

                static const ZyanU8 scales[2][3][3] =
                {
                    /*B0*/ { /*16*/ { 16, 32, 64 }, /*32*/ { 16, 32, 64 }, /*64*/ { 16, 32, 64 } },
                    /*B1*/ { /*16*/ {  2,  2,  2 }, /*32*/ {  4,  4,  4 }, /*64*/ {  8,  8,  8 } }
                };
                static const ZydisBroadcastMode broadcasts[2][3][3] =
                {
                    /*B0*/
                    {
                        /*16*/
                        {
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID
                        },
                        /*32*/
                        {
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID
                        },
                        /*64*/
                        {
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID
                        }
                    },
                    /*B1*/
                    {
                        /*16*/
                        {
                            ZYDIS_BROADCAST_MODE_1_TO_8,
                            ZYDIS_BROADCAST_MODE_1_TO_16,
                            ZYDIS_BROADCAST_MODE_1_TO_32
                        },
                        /*32*/
                        {
                            ZYDIS_BROADCAST_MODE_1_TO_4,
                            ZYDIS_BROADCAST_MODE_1_TO_8,
                            ZYDIS_BROADCAST_MODE_1_TO_16
                        },
                        /*64*/
                        {
                            ZYDIS_BROADCAST_MODE_1_TO_2,
                            ZYDIS_BROADCAST_MODE_1_TO_4,
                            ZYDIS_BROADCAST_MODE_1_TO_8
                        }
                    }
                };

                const ZyanU8 size_index = context->evex.element_size >> 5;
                ZYAN_ASSERT(size_index < 3);

                context->cd8_scale = scales[evex_b][size_index][vector_length];
                instruction->avx.broadcast.mode = broadcasts[evex_b][size_index][vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_HV:
            {
                const ZyanU8 evex_b = instruction->raw.evex.b;
                ZYAN_ASSERT(evex_b < 2);
                ZYAN_ASSERT(!context->vector_unified.W);
                ZYAN_ASSERT((context->evex.element_size == 16) ||
                            (context->evex.element_size == 32));
                ZYAN_ASSERT(!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC);

                static const ZyanU8 scales[2][2][3] =
                {
                    /*B0*/ { /*16*/ {  8, 16, 32 }, /*32*/ {  8, 16, 32 } },
                    /*B1*/ { /*16*/ {  2,  2,  2 }, /*32*/ {  4,  4,  4 } }
                };
                static const ZydisBroadcastMode broadcasts[2][2][3] =
                {
                    /*B0*/
                    {
                        /*16*/
                        {
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID
                        },
                        /*32*/
                        {
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID,
                            ZYDIS_BROADCAST_MODE_INVALID
                        }
                    },
                    /*B1*/
                    {
                        /*16*/
                        {
                            ZYDIS_BROADCAST_MODE_1_TO_4,
                            ZYDIS_BROADCAST_MODE_1_TO_8,
                            ZYDIS_BROADCAST_MODE_1_TO_16
                        },
                        /*32*/
                        {
                            ZYDIS_BROADCAST_MODE_1_TO_2,
                            ZYDIS_BROADCAST_MODE_1_TO_4,
                            ZYDIS_BROADCAST_MODE_1_TO_8
                        }
                    }
                };

                const ZyanU8 size_index = context->evex.element_size >> 5;
                ZYAN_ASSERT(size_index < 3);

                context->cd8_scale = scales[evex_b][size_index][vector_length];
                instruction->avx.broadcast.mode = broadcasts[evex_b][size_index][vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_FVM:
            {
                static const ZyanU8 scales[3] =
                {
                    16, 32, 64
                };
                context->cd8_scale = scales[vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_GSCAT:
                switch (context->vector_unified.W)
                {
                case 0:
                    ZYAN_ASSERT(context->evex.element_size == 32);
                    break;
                case 1:
                    ZYAN_ASSERT(context->evex.element_size == 64);
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
                ZYAN_FALLTHROUGH;
            case ZYDIS_TUPLETYPE_T1S:
            {
                static const ZyanU8 scales[6] =
                {
                    /*   */  0,
                    /*  8*/  1,
                    /* 16*/  2,
                    /* 32*/  4,
                    /* 64*/  8,
                    /*128*/ 16,
                };
                ZYAN_ASSERT(def->element_size < ZYAN_ARRAY_LENGTH(scales));
                context->cd8_scale = scales[def->element_size];
                break;
            };
            case ZYDIS_TUPLETYPE_T1F:
            {
                static const ZyanU8 scales[3] =
                {
                    /* 16*/ 2,
                    /* 32*/ 4,
                    /* 64*/ 8
                };

                const ZyanU8 size_index = context->evex.element_size >> 5;
                ZYAN_ASSERT(size_index < 3);

                context->cd8_scale = scales[size_index];
                break;
            }
            case ZYDIS_TUPLETYPE_T1_4X:
                ZYAN_ASSERT(context->evex.element_size == 32);
                ZYAN_ASSERT(context->vector_unified.W == 0);
                context->cd8_scale = 16;
                break;
            case ZYDIS_TUPLETYPE_T2:
                switch (context->vector_unified.W)
                {
                case 0:
                    ZYAN_ASSERT(context->evex.element_size == 32);
                    context->cd8_scale = 8;
                    break;
                case 1:
                    ZYAN_ASSERT(context->evex.element_size == 64);
                    ZYAN_ASSERT((instruction->avx.vector_length == 256) ||
                                (instruction->avx.vector_length == 512));
                    context->cd8_scale = 16;
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
                break;
            case ZYDIS_TUPLETYPE_T4:
                switch (context->vector_unified.W)
                {
                case 0:
                    ZYAN_ASSERT(context->evex.element_size == 32);
                    ZYAN_ASSERT((instruction->avx.vector_length == 256) ||
                                (instruction->avx.vector_length == 512));
                    context->cd8_scale = 16;
                    break;
                case 1:
                    ZYAN_ASSERT(context->evex.element_size == 64);
                    ZYAN_ASSERT(instruction->avx.vector_length == 512);
                    context->cd8_scale = 32;
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
                break;
            case ZYDIS_TUPLETYPE_T8:
                ZYAN_ASSERT(!context->vector_unified.W);
                ZYAN_ASSERT(instruction->avx.vector_length == 512);
                ZYAN_ASSERT(context->evex.element_size == 32);
                context->cd8_scale = 32;
                break;
            case ZYDIS_TUPLETYPE_HVM:
            {
                static const ZyanU8 scales[3] =
                {
                     8, 16, 32
                };
                context->cd8_scale = scales[vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_QVM:
            {
                static const ZyanU8 scales[3] =
                {
                     4,  8, 16
                };
                context->cd8_scale = scales[vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_OVM:
            {
                static const ZyanU8 scales[3] =
                {
                     2,  4,  8
                };
                context->cd8_scale = scales[vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_M128:
                context->cd8_scale = 16;
                break;
            case ZYDIS_TUPLETYPE_DUP:
            {
                static const ZyanU8 scales[3] =
                {
                     8, 32, 64
                };
                context->cd8_scale = scales[vector_length];
                break;
            }
            case ZYDIS_TUPLETYPE_QUARTER:
            {
                const ZyanU8 evex_b = instruction->raw.evex.b;
                ZYAN_ASSERT(evex_b < 2);
                ZYAN_ASSERT(!context->vector_unified.W);
                ZYAN_ASSERT(context->evex.element_size == 16);
                ZYAN_ASSERT(!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC);

                static const ZyanU8 scales[2][3] =
                {
                    /*B0*/ {  4,  8, 16 },
                    /*B1*/ {  2,  2,  2 }
                };
                static const ZydisBroadcastMode broadcasts[2][3] =
                {
                    /*B0*/
                    {
                        ZYDIS_BROADCAST_MODE_INVALID,
                        ZYDIS_BROADCAST_MODE_INVALID,
                        ZYDIS_BROADCAST_MODE_INVALID
                    },
                    /*B1*/
                    {
                        ZYDIS_BROADCAST_MODE_1_TO_2,
                        ZYDIS_BROADCAST_MODE_1_TO_4,
                        ZYDIS_BROADCAST_MODE_1_TO_8
                    }
                };
                context->cd8_scale = scales[evex_b][vector_length];
                instruction->avx.broadcast.mode = broadcasts[evex_b][vector_length];
                break;
            }
            default:
                ZYAN_UNREACHABLE;
            }
        } else
        {
            ZYAN_ASSERT(instruction->raw.modrm.mod == 3);
        }

        // Static broadcast-factor
        if (def->broadcast)
        {
            ZYAN_ASSERT(!instruction->avx.broadcast.mode);
            instruction->avx.broadcast.is_static = ZYAN_TRUE;
            static const ZydisBroadcastMode broadcasts[ZYDIS_EVEX_STATIC_BROADCAST_MAX_VALUE + 1] =
            {
                ZYDIS_BROADCAST_MODE_INVALID,
                ZYDIS_BROADCAST_MODE_1_TO_2,
                ZYDIS_BROADCAST_MODE_1_TO_4,
                ZYDIS_BROADCAST_MODE_1_TO_8,
                ZYDIS_BROADCAST_MODE_1_TO_16,
                ZYDIS_BROADCAST_MODE_1_TO_32,
                ZYDIS_BROADCAST_MODE_1_TO_64,
                ZYDIS_BROADCAST_MODE_2_TO_4,
                ZYDIS_BROADCAST_MODE_2_TO_8,
                ZYDIS_BROADCAST_MODE_2_TO_16,
                ZYDIS_BROADCAST_MODE_4_TO_8,
                ZYDIS_BROADCAST_MODE_4_TO_16,
                ZYDIS_BROADCAST_MODE_8_TO_16
            };
            ZYAN_ASSERT(def->broadcast < ZYAN_ARRAY_LENGTH(broadcasts));
            instruction->avx.broadcast.mode = broadcasts[def->broadcast];
        }

        // Rounding mode and SAE
        if (instruction->raw.evex.b)
        {
            switch (def->functionality)
            {
            case ZYDIS_EVEX_FUNC_INVALID:
            case ZYDIS_EVEX_FUNC_BC:
                // Noting to do here
                break;
            case ZYDIS_EVEX_FUNC_RC:
                instruction->avx.rounding.mode = ZYDIS_ROUNDING_MODE_RN + context->vector_unified.LL;
                ZYAN_FALLTHROUGH;
            case ZYDIS_EVEX_FUNC_SAE:
                instruction->avx.has_sae = ZYAN_TRUE;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
        }

        // Mask
        instruction->avx.mask.reg = ZYDIS_REGISTER_K0 + instruction->raw.evex.aaa;
        switch (def->mask_override)
        {
        case ZYDIS_MASK_OVERRIDE_DEFAULT:
            instruction->avx.mask.mode = ZYDIS_MASK_MODE_MERGING + instruction->raw.evex.z;
            break;
        case ZYDIS_MASK_OVERRIDE_ZEROING:
            instruction->avx.mask.mode = ZYDIS_MASK_MODE_ZEROING;
            break;
        case ZYDIS_MASK_OVERRIDE_CONTROL:
            instruction->avx.mask.mode = ZYDIS_MASK_MODE_CONTROL + instruction->raw.evex.z;
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        if (!instruction->raw.evex.aaa)
        {
            instruction->avx.mask.mode = ZYDIS_MASK_MODE_DISABLED;
        }
#else
        ZYAN_UNREACHABLE;
#endif
        break;
    }
    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
    {
#ifndef ZYDIS_DISABLE_KNC
        // Vector length
        instruction->avx.vector_length = 512;

        const ZydisInstructionDefinitionMVEX* def =
            (const ZydisInstructionDefinitionMVEX*)definition;

        // Static broadcast-factor
        ZyanU8 index = def->has_element_granularity;
        ZYAN_ASSERT(!index || !def->broadcast);
        if (!index && def->broadcast)
        {
            instruction->avx.broadcast.is_static = ZYAN_TRUE;
            switch (def->broadcast)
            {
            case ZYDIS_MVEX_STATIC_BROADCAST_1_TO_8:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
                index = 1;
                break;
            case ZYDIS_MVEX_STATIC_BROADCAST_1_TO_16:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
                index = 1;
                break;
            case ZYDIS_MVEX_STATIC_BROADCAST_4_TO_8:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
                index = 2;
                break;
            case ZYDIS_MVEX_STATIC_BROADCAST_4_TO_16:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
                index = 2;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
        }

        // Compressed disp8 scale and broadcast-factor
        switch (def->functionality)
        {
        case ZYDIS_MVEX_FUNC_IGNORED:
        case ZYDIS_MVEX_FUNC_INVALID:
        case ZYDIS_MVEX_FUNC_RC:
        case ZYDIS_MVEX_FUNC_SAE:
        case ZYDIS_MVEX_FUNC_SWIZZLE_32:
        case ZYDIS_MVEX_FUNC_SWIZZLE_64:
            // Nothing to do here
            break;
        case ZYDIS_MVEX_FUNC_F_32:
        case ZYDIS_MVEX_FUNC_I_32:
        case ZYDIS_MVEX_FUNC_F_64:
        case ZYDIS_MVEX_FUNC_I_64:
            context->cd8_scale = 64;
            break;
        case ZYDIS_MVEX_FUNC_SF_32:
        case ZYDIS_MVEX_FUNC_SF_32_BCST:
        case ZYDIS_MVEX_FUNC_SF_32_BCST_4TO16:
        case ZYDIS_MVEX_FUNC_UF_32:
        {
            static const ZyanU8 lookup[3][8] =
            {
                { 64,  4, 16, 32, 16, 16, 32, 32 },
                {  4,  0,  0,  2,  1,  1,  2,  2 },
                { 16,  0,  0,  8,  4,  4,  8,  8 }
            };
            ZYAN_ASSERT(instruction->raw.mvex.SSS < ZYAN_ARRAY_LENGTH(lookup[index]));
            context->cd8_scale = lookup[index][instruction->raw.mvex.SSS];
            break;
        }
        case ZYDIS_MVEX_FUNC_SI_32:
        case ZYDIS_MVEX_FUNC_UI_32:
        case ZYDIS_MVEX_FUNC_SI_32_BCST:
        case ZYDIS_MVEX_FUNC_SI_32_BCST_4TO16:
        {
            static const ZyanU8 lookup[3][8] =
            {
                { 64,  4, 16,  0, 16, 16, 32, 32 },
                {  4,  0,  0,  0,  1,  1,  2,  2 },
                { 16,  0,  0,  0,  4,  4,  8,  8 }
            };
            ZYAN_ASSERT(instruction->raw.mvex.SSS < ZYAN_ARRAY_LENGTH(lookup[index]));
            context->cd8_scale = lookup[index][instruction->raw.mvex.SSS];
            break;
        }
        case ZYDIS_MVEX_FUNC_SF_64:
        case ZYDIS_MVEX_FUNC_UF_64:
        case ZYDIS_MVEX_FUNC_SI_64:
        case ZYDIS_MVEX_FUNC_UI_64:
        {
            static const ZyanU8 lookup[3][3] =
            {
                { 64,  8, 32 },
                {  8,  0,  0 },
                { 32,  0,  0 }
            };
            ZYAN_ASSERT(instruction->raw.mvex.SSS < ZYAN_ARRAY_LENGTH(lookup[index]));
            context->cd8_scale = lookup[index][instruction->raw.mvex.SSS];
            break;
        }
        case ZYDIS_MVEX_FUNC_DF_32:
        case ZYDIS_MVEX_FUNC_DI_32:
        {
            static const ZyanU8 lookup[2][8] =
            {
                { 64,  0,  0, 32, 16, 16, 32, 32 },
                {  4,  0,  0,  2,  1,  1,  2,  2 }
            };
            ZYAN_ASSERT(index < 2);
            ZYAN_ASSERT(instruction->raw.mvex.SSS < ZYAN_ARRAY_LENGTH(lookup[index]));
            context->cd8_scale = lookup[index][instruction->raw.mvex.SSS];
            break;
        }
        case ZYDIS_MVEX_FUNC_DF_64:
        case ZYDIS_MVEX_FUNC_DI_64:
        {
            static const ZyanU8 lookup[2][1] =
            {
                { 64 },
                {  8 }
            };
            ZYAN_ASSERT(index < 2);
            ZYAN_ASSERT(instruction->raw.mvex.SSS < ZYAN_ARRAY_LENGTH(lookup[index]));
            context->cd8_scale = lookup[index][instruction->raw.mvex.SSS];
            break;
        }
        default:
            ZYAN_UNREACHABLE;
        }

        // Rounding mode, sae, swizzle, convert
        context->mvex.functionality = def->functionality;
        switch (def->functionality)
        {
        case ZYDIS_MVEX_FUNC_IGNORED:
        case ZYDIS_MVEX_FUNC_INVALID:
        case ZYDIS_MVEX_FUNC_F_32:
        case ZYDIS_MVEX_FUNC_I_32:
        case ZYDIS_MVEX_FUNC_F_64:
        case ZYDIS_MVEX_FUNC_I_64:
            // Nothing to do here
            break;
        case ZYDIS_MVEX_FUNC_RC:
            instruction->avx.rounding.mode = ZYDIS_ROUNDING_MODE_RN + (instruction->raw.mvex.SSS & 3);
            ZYAN_FALLTHROUGH;
        case ZYDIS_MVEX_FUNC_SAE:
            if (instruction->raw.mvex.SSS >= 4)
            {
                instruction->avx.has_sae = ZYAN_TRUE;
            }
            break;
        case ZYDIS_MVEX_FUNC_SWIZZLE_32:
        case ZYDIS_MVEX_FUNC_SWIZZLE_64:
            instruction->avx.swizzle.mode = ZYDIS_SWIZZLE_MODE_DCBA + instruction->raw.mvex.SSS;
            break;
        case ZYDIS_MVEX_FUNC_SF_32:
        case ZYDIS_MVEX_FUNC_SF_32_BCST:
        case ZYDIS_MVEX_FUNC_SF_32_BCST_4TO16:
            switch (instruction->raw.mvex.SSS)
            {
            case 0:
                break;
            case 1:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
                break;
            case 2:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
                break;
            case 3:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
                break;
            case 4:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT8;
                break;
            case 5:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
                break;
            case 6:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT16;
                break;
            case 7:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
            break;
        case ZYDIS_MVEX_FUNC_SI_32:
        case ZYDIS_MVEX_FUNC_SI_32_BCST:
        case ZYDIS_MVEX_FUNC_SI_32_BCST_4TO16:
            switch (instruction->raw.mvex.SSS)
            {
            case 0:
                break;
            case 1:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
                break;
            case 2:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
                break;
            case 4:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT8;
                break;
            case 5:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
                break;
            case 6:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT16;
                break;
            case 7:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
            break;
        case ZYDIS_MVEX_FUNC_SF_64:
        case ZYDIS_MVEX_FUNC_SI_64:
            switch (instruction->raw.mvex.SSS)
            {
            case 0:
                break;
            case 1:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
                break;
            case 2:
                instruction->avx.broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
            break;
        case ZYDIS_MVEX_FUNC_UF_32:
        case ZYDIS_MVEX_FUNC_DF_32:
            switch (instruction->raw.mvex.SSS)
            {
            case 0:
                break;
            case 3:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
                break;
            case 4:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT8;
                break;
            case 5:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
                break;
            case 6:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT16;
                break;
            case 7:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
            break;
        case ZYDIS_MVEX_FUNC_UF_64:
        case ZYDIS_MVEX_FUNC_DF_64:
            break;
        case ZYDIS_MVEX_FUNC_UI_32:
        case ZYDIS_MVEX_FUNC_DI_32:
            switch (instruction->raw.mvex.SSS)
            {
            case 0:
                break;
            case 4:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT8;
                break;
            case 5:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
                break;
            case 6:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_UINT16;
                break;
            case 7:
                instruction->avx.conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
                break;
            default:
                ZYAN_UNREACHABLE;
            }
            break;
        case ZYDIS_MVEX_FUNC_UI_64:
        case ZYDIS_MVEX_FUNC_DI_64:
            break;
        default:
            ZYAN_UNREACHABLE;
        }

        // Eviction hint
        if ((instruction->raw.modrm.mod != 3) && instruction->raw.mvex.E)
        {
            instruction->avx.has_eviction_hint = ZYAN_TRUE;
        }

        // Mask
        instruction->avx.mask.mode = ZYDIS_MASK_MODE_MERGING;
        instruction->avx.mask.reg = ZYDIS_REGISTER_K0 + instruction->raw.mvex.kkk;
#else
        ZYAN_UNREACHABLE;
#endif
        break;
    }
    default:
        // Nothing to do here
        break;
    }
}